

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::moveIndex32(UnicodeString *this,int32_t index,int32_t delta)

{
  short sVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  char16_t *pcVar8;
  char16_t cVar9;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (this->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  uVar2 = index;
  if ((int)uVar4 < index) {
    uVar2 = uVar4;
  }
  uVar3 = 0;
  if (-1 < index) {
    uVar3 = (ulong)uVar2;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar8 = (this->fUnion).fFields.fArray;
  }
  else {
    pcVar8 = (char16_t *)((long)&this->fUnion + 2);
  }
  if (delta < 1) {
    iVar6 = -delta;
    while ((uVar2 = (uint)uVar3, 0 < iVar6 && (0 < (int)uVar2))) {
      uVar5 = (ulong)(uVar2 - 1);
      if (((pcVar8[uVar5] & 0xfc00U) == 0xdc00) &&
         ((1 < uVar2 && ((pcVar8[uVar3 - 2] & 0xfc00U) == 0xd800)))) {
        uVar5 = (ulong)(uVar2 - 2);
      }
      uVar3 = uVar5;
      iVar6 = iVar6 + -1;
    }
  }
  else {
    for (; uVar2 = (uint)uVar3, 0 < delta; delta = delta + -1) {
      if ((int)uVar2 < (int)uVar4) {
        cVar9 = pcVar8[(int)uVar2];
      }
      else {
        if (-1 < (int)uVar4) {
          return uVar2;
        }
        cVar9 = pcVar8[(int)uVar2];
        if (cVar9 == L'\0') {
          return uVar2;
        }
      }
      uVar7 = uVar2 + 1;
      if ((((cVar9 & 0xfc00U) == 0xd800) && (uVar7 != uVar4)) &&
         ((pcVar8[(int)uVar7] & 0xfc00U) == 0xdc00)) {
        uVar7 = uVar2 + 2;
      }
      uVar3 = (ulong)uVar7;
    }
  }
  return uVar2;
}

Assistant:

inline UBool
UnicodeString::hasShortLength() const {
  return fUnion.fFields.fLengthAndFlags>=0;
}